

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,ehooks_t *ehooks,uint ind,pszind_t *pind_last,
                size_t *duckdb_je_extent_sn_next,size_t size,size_t alignment)

{
  int8_t *piVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  extent_hooks_t *peVar4;
  uint64_t uVar5;
  uint uVar6;
  base_t *pbVar7;
  base_block_t *b;
  ulong uVar8;
  base_block_t *addr;
  tsd_t *ptVar9;
  base_block_t *pbVar10;
  uint uVar11;
  undefined4 in_register_0000000c;
  uint *puVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  _Bool local_52;
  _Bool zero;
  base_t *local_50;
  pthread_mutex_t *local_48;
  uint *local_40;
  uint64_t *local_38;
  
  puVar12 = (uint *)CONCAT44(in_register_0000000c,ind);
  uVar8 = size + 0xf & 0xfffffffffffffff0;
  uVar8 = (uVar8 + 0x8f & -uVar8) + ((long)duckdb_je_extent_sn_next + (uVar8 - 1) & -uVar8);
  if (uVar8 < 0x7000000000000001) {
    uVar15 = uVar8 * 2 - 1;
    lVar13 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    uVar15 = 0xfff;
    if (0xe < (uint)lVar13) {
      uVar15 = ~(-1L << ((char)lVar13 - 3U & 0x3f));
    }
    uVar8 = (~uVar15 & uVar8 + uVar15) + 0x1fffff;
  }
  else {
    uVar8 = 0x7000000000200fff;
  }
  uVar11 = *puVar12 + 1;
  uVar6 = *puVar12;
  if (uVar11 < 0xc6) {
    uVar6 = uVar11;
  }
  uVar15 = duckdb_je_sz_pind2sz_tab[uVar6] + 0x1fffff;
  if (duckdb_je_sz_pind2sz_tab[uVar6] + 0x1fffff < uVar8) {
    uVar15 = uVar8;
  }
  uVar15 = uVar15 & 0xffffffffffe00000;
  zero = true;
  local_52 = true;
  local_50 = base;
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    addr = (base_block_t *)duckdb_je_extent_alloc_mmap((void *)0x0,uVar15,0x200000,&zero,&local_52);
  }
  else {
    peVar4 = (extent_hooks_t *)(ehooks->ptr).repr;
    if (peVar4 == &duckdb_je_ehooks_default_extent_hooks) {
      addr = (base_block_t *)
             duckdb_je_ehooks_default_alloc_impl
                       (tsdn,(void *)0x0,uVar15,0x200000,&zero,&local_52,ehooks->ind);
    }
    else {
      ptVar9 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar9 = (tsd_t *)__tls_get_addr(&PTR_024e0b60), (ptVar9->state).repr != '\0')) {
        ptVar9 = duckdb_je_tsd_fetch_slow(ptVar9,false);
      }
      ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((ptVar9->state).repr == '\0') {
        duckdb_je_tsd_slow_update(ptVar9);
      }
      addr = (base_block_t *)
             (*peVar4->alloc)(peVar4,(void *)0x0,uVar15,0x200000,&zero,&local_52,ehooks->ind);
      ptVar9 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar9 = (tsd_t *)__tls_get_addr(&PTR_024e0b60), (ptVar9->state).repr != '\0')) {
        ptVar9 = duckdb_je_tsd_fetch_slow(ptVar9,false);
      }
      piVar1 = &ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(ptVar9);
      }
    }
  }
  pbVar7 = local_50;
  if (addr == (base_block_t *)0x0) {
    addr = (base_block_t *)0x0;
  }
  else {
    local_40 = puVar12;
    if ((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
       (duckdb_je_init_system_thp_mode == thp_mode_default)) {
      if (duckdb_je_opt_metadata_thp == metadata_thp_always) {
        duckdb_je_pages_huge(addr,uVar15);
      }
      else if (local_50 != (base_t *)0x0 && duckdb_je_opt_metadata_thp == metadata_thp_auto) {
        local_48 = (pthread_mutex_t *)((long)&(local_50->mtx).field_0 + 0x48);
        iVar14 = pthread_mutex_trylock(local_48);
        if (iVar14 != 0) {
          duckdb_je_malloc_mutex_lock_slow(&pbVar7->mtx);
          (pbVar7->mtx).field_0.field_0.locked.repr = true;
        }
        puVar2 = &(pbVar7->mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar2 = *puVar2 + 1;
        if ((pbVar7->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
          (pbVar7->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
          ppwVar3 = &(pbVar7->mtx).field_0.witness.link.qre_prev;
          *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
        }
        local_38 = (uint64_t *)pind_last;
        if (pbVar7->auto_thp_switched == false) {
          pbVar10 = pbVar7->blocks;
          if ((pbVar7->ehooks).ind == 0) {
            lVar13 = 4;
            do {
              pbVar10 = pbVar10->next;
              lVar13 = lVar13 + -1;
            } while (pbVar10 != (base_block_t *)0x0);
          }
          else {
            lVar13 = 1;
            do {
              pbVar10 = pbVar10->next;
              lVar13 = lVar13 + -1;
            } while (pbVar10 != (base_block_t *)0x0);
          }
          if (lVar13 == 0) {
            pbVar7->auto_thp_switched = true;
            for (pbVar10 = pbVar7->blocks; pbVar10 != (base_block_t *)0x0; pbVar10 = pbVar10->next)
            {
              duckdb_je_pages_huge(pbVar10,pbVar10->size);
              pbVar7->n_thp =
                   pbVar7->n_thp +
                   ((pbVar10->size - (pbVar10->edata).field_2.e_size_esn) + 0x1fffff >> 0x15);
            }
          }
        }
        if (pbVar7->auto_thp_switched == true) {
          duckdb_je_pages_huge(addr,uVar15);
        }
        (pbVar7->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(local_48);
        pind_last = (pszind_t *)local_38;
      }
    }
    if (uVar15 < 0x7000000000000001) {
      uVar8 = uVar15 - 1;
      lVar13 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      uVar11 = (uint)lVar13 ^ 0x3f;
      iVar14 = 0x32 - uVar11;
      if (0x32 < uVar11) {
        iVar14 = 0;
      }
      uVar11 = ((uint)(uVar8 >> ((char)iVar14 + 0xbU & 0x3f)) & 3) + iVar14 * 4;
    }
    else {
      uVar11 = 199;
    }
    *local_40 = uVar11;
    addr->size = uVar15;
    addr->next = (base_block_t *)0x0;
    uVar5 = *(uint64_t *)pind_last;
    *(uint64_t *)pind_last = uVar5 + 1;
    (addr->edata).e_addr = addr + 1;
    (addr->edata).field_2.e_size_esn = uVar15 - 0x90;
    (addr->edata).e_sn = uVar5;
    (addr->edata).e_bits = (addr->edata).e_bits & 0xfffffffffe800fff | 0xe80afff;
  }
  return addr;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, ehooks_t *ehooks, unsigned ind,
    pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, ehooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_edata_init(extent_sn_next, &block->edata,
	    (void *)((byte_t *)block + header_size), block_size - header_size);
	return block;
}